

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

FrameDisplay * __thiscall
Js::InterpreterStackFrame::OP_LdFrameDisplay
          (InterpreterStackFrame *this,void *argHead,void *argEnv,ScriptContext *scriptContext)

{
  FrameDisplay *pFVar1;
  
  if ((*(byte *)(*(long *)(this + 0x88) + 0x46) & 1) == 0) {
    pFVar1 = JavascriptOperators::OP_LdFrameDisplay(argHead,argEnv,scriptContext);
    return pFVar1;
  }
  pFVar1 = JavascriptOperators::OP_LdStrictFrameDisplay(argHead,argEnv,scriptContext);
  return pFVar1;
}

Assistant:

FrameDisplay *
        InterpreterStackFrame::OP_LdFrameDisplay(void *argHead, void *argEnv, ScriptContext *scriptContext)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();
        if (strict)
        {
            frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplay(argHead, argEnv, scriptContext);
        }
        else
        {
            frameDisplay = JavascriptOperators::OP_LdFrameDisplay(argHead, argEnv, scriptContext);
        }
        return frameDisplay;
    }